

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

void __thiscall kj::UnixEventPort::FdObserver::fire(FdObserver *this,short events)

{
  PromiseFulfiller<void> *pPVar1;
  Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> local_a8;
  undefined1 local_91;
  Own<kj::PromiseFulfiller<void>_> *local_90;
  Own<kj::PromiseFulfiller<void>_> *f_3;
  undefined1 local_71;
  Own<kj::PromiseFulfiller<void>_> *local_70;
  Own<kj::PromiseFulfiller<void>_> *f_2;
  undefined1 local_51;
  Own<kj::PromiseFulfiller<void>_> *local_50;
  Own<kj::PromiseFulfiller<void>_> *f_1;
  Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> local_38;
  undefined1 local_21;
  Own<kj::PromiseFulfiller<void>_> *local_20;
  Own<kj::PromiseFulfiller<void>_> *f;
  FdObserver *pFStack_10;
  short events_local;
  FdObserver *this_local;
  
  f._6_2_ = events;
  pFStack_10 = this;
  if ((events & 0x2019U) != 0) {
    if ((events & 0x2010U) == 0) {
      f._4_1_ = 0;
      Maybe<bool>::operator=(&this->atEnd,(bool *)((long)&f + 4));
    }
    else {
      f._5_1_ = 1;
      Maybe<bool>::operator=(&this->atEnd,(bool *)((long)&f + 5));
    }
    local_20 = _::readMaybe<kj::PromiseFulfiller<void>>(&this->readFulfiller);
    if (local_20 != (Own<kj::PromiseFulfiller<void>_> *)0x0) {
      pPVar1 = Own<kj::PromiseFulfiller<void>_>::get(local_20);
      (**pPVar1->_vptr_PromiseFulfiller)(pPVar1,&local_21);
      Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::Maybe(&local_38,(void *)0x0);
      Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::operator=(&this->readFulfiller,&local_38);
      Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::~Maybe(&local_38);
    }
  }
  if (((f._6_2_ & 0x1c) != 0) &&
     (local_50 = _::readMaybe<kj::PromiseFulfiller<void>>(&this->writeFulfiller),
     local_50 != (Own<kj::PromiseFulfiller<void>_> *)0x0)) {
    pPVar1 = Own<kj::PromiseFulfiller<void>_>::get(local_50);
    (**pPVar1->_vptr_PromiseFulfiller)(pPVar1,&local_51);
    Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::Maybe
              ((Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> *)&f_2,(void *)0x0);
    Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::operator=
              (&this->writeFulfiller,(Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> *)&f_2);
    Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::~Maybe
              ((Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> *)&f_2);
  }
  if (((f._6_2_ & 0x18) != 0) &&
     (local_70 = _::readMaybe<kj::PromiseFulfiller<void>>(&this->hupFulfiller),
     local_70 != (Own<kj::PromiseFulfiller<void>_> *)0x0)) {
    pPVar1 = Own<kj::PromiseFulfiller<void>_>::get(local_70);
    (**pPVar1->_vptr_PromiseFulfiller)(pPVar1,&local_71);
    Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::Maybe
              ((Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> *)&f_3,(void *)0x0);
    Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::operator=
              (&this->hupFulfiller,(Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> *)&f_3);
    Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::~Maybe
              ((Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> *)&f_3);
  }
  if (((f._6_2_ & 2) != 0) &&
     (local_90 = _::readMaybe<kj::PromiseFulfiller<void>>(&this->urgentFulfiller),
     local_90 != (Own<kj::PromiseFulfiller<void>_> *)0x0)) {
    pPVar1 = Own<kj::PromiseFulfiller<void>_>::get(local_90);
    (**pPVar1->_vptr_PromiseFulfiller)(pPVar1,&local_91);
    Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::Maybe(&local_a8,(void *)0x0);
    Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::operator=(&this->urgentFulfiller,&local_a8);
    Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::~Maybe(&local_a8);
  }
  return;
}

Assistant:

void UnixEventPort::FdObserver::fire(short events) {
  if (events & (EPOLLIN | EPOLLHUP | EPOLLRDHUP | EPOLLERR)) {
    if (events & (EPOLLHUP | EPOLLRDHUP)) {
      atEnd = true;
    } else {
      // Since we didn't receive EPOLLRDHUP, we know that we're not at the end.
      atEnd = false;
    }

    KJ_IF_MAYBE(f, readFulfiller) {
      f->get()->fulfill();
      readFulfiller = nullptr;
    }
  }

  if (events & (EPOLLOUT | EPOLLHUP | EPOLLERR)) {
    KJ_IF_MAYBE(f, writeFulfiller) {
      f->get()->fulfill();
      writeFulfiller = nullptr;
    }
  }

  if (events & (EPOLLHUP | EPOLLERR)) {
    KJ_IF_MAYBE(f, hupFulfiller) {
      f->get()->fulfill();
      hupFulfiller = nullptr;
    }
  }

  if (events & EPOLLPRI) {
    KJ_IF_MAYBE(f, urgentFulfiller) {
      f->get()->fulfill();
      urgentFulfiller = nullptr;
    }
  }
}